

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ConstantPaddingLayerParams::ByteSizeLong(ConstantPaddingLayerParams *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->padamounts_);
  if (sVar2 == 0) {
    lVar5 = 0;
  }
  else {
    uVar4 = (long)(int)sVar2 | 1;
    lVar5 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    lVar5 = (ulong)((int)lVar5 * 9 + 0x49U >> 6) + 1;
  }
  (this->_padamounts_cached_byte_size_).super___atomic_base<int>._M_i = (int)sVar2;
  lVar1 = lVar5 + 5;
  if (this->value_ == 0.0) {
    lVar1 = lVar5;
  }
  sVar3 = lVar1 + sVar2 + 2;
  if (this->padtogivenoutputsizemode_ == false) {
    sVar3 = lVar1 + sVar2;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t ConstantPaddingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConstantPaddingLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 padAmounts = 2;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->padamounts_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _padamounts_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // float value = 1;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_value = this->_internal_value();
  uint32_t raw_value;
  memcpy(&raw_value, &tmp_value, sizeof(tmp_value));
  if (raw_value != 0) {
    total_size += 1 + 4;
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->_internal_padtogivenoutputsizemode() != 0) {
    total_size += 1 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}